

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

bool __thiscall cmGlobalNinjaGenerator::OpenRulesFileStream(cmGlobalNinjaGenerator *this)

{
  bool bVar1;
  ostream *poVar2;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,NINJA_RULES_FILE,&local_39)
  ;
  bVar1 = OpenFileStream(this,&this->RulesFileStream,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)
                             (this->RulesFileStream)._M_t.
                             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
                             "# This file contains all the rules used to get the outputs files\n");
    poVar2 = std::operator<<(poVar2,"# built from the input files.\n");
    poVar2 = std::operator<<(poVar2,"# It is included in the main \'");
    poVar2 = std::operator<<(poVar2,NINJA_BUILD_FILE);
    std::operator<<(poVar2,"\'.\n\n");
  }
  return bVar1;
}

Assistant:

bool cmGlobalNinjaGenerator::OpenRulesFileStream()
{
  if (!this->OpenFileStream(this->RulesFileStream,
                            cmGlobalNinjaGenerator::NINJA_RULES_FILE)) {
    return false;
  }

  // Write comment about this file.
  /* clang-format off */
  *this->RulesFileStream
    << "# This file contains all the rules used to get the outputs files\n"
    << "# built from the input files.\n"
    << "# It is included in the main '" << NINJA_BUILD_FILE << "'.\n\n"
    ;
  /* clang-format on */
  return true;
}